

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testFromCharArray(String *str)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  bool bVar5;
  String substr;
  
  if ((str->view_)._M_str == "abc") {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.data() != charArray) failed on line ");
    iVar1 = 0x68;
LAB_001aff29:
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::operator<<(poVar4,"\n");
    return false;
  }
  if ((str->view_)._M_len != 3) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.size() == sizeof(charArray) - 1) failed on line "
                            );
    iVar1 = 0x69;
    goto LAB_001aff29;
  }
  bVar2 = cm::String::is_stable(str);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.is_stable()) failed on line ");
    iVar1 = 0x6a;
    goto LAB_001aff29;
  }
  pcVar3 = cm::String::c_str(str);
  if (pcVar3 == "abc") {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str.c_str() != charArray) failed on line ");
    iVar1 = 0x6b;
    goto LAB_001aff29;
  }
  bVar2 = cm::String::is_stable(str);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ");
    iVar1 = 0x6c;
    goto LAB_001aff29;
  }
  cm::String::substr(&substr,str,1,0xffffffffffffffff);
  if (substr.view_._M_str == "bc") {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr_const.data() != &charArray[1]) failed on line ");
    iVar1 = 0x6f;
  }
  else if (substr.view_._M_len == 2) {
    bVar2 = cm::String::is_stable(&substr);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!substr_const.is_stable()) failed on line ");
      iVar1 = 0x71;
    }
    else {
      pcVar3 = cm::String::c_str(&substr);
      if (pcVar3 == "bc") {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(substr.c_str() != &charArray[1]) failed on line ");
        iVar1 = 0x72;
      }
      else {
        bVar2 = cm::String::is_stable(&substr);
        bVar5 = true;
        if (!bVar2) goto LAB_001aff93;
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!substr.is_stable()) failed on line ");
        iVar1 = 0x73;
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr_const.size() == 2) failed on line ");
    iVar1 = 0x70;
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,"\n");
  bVar5 = false;
LAB_001aff93:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&substr.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar5;
}

Assistant:

static bool testFromCharArray(cm::String str)
{
  cm::String const& str_const = str;
  ASSERT_TRUE(str_const.data() != charArray);
  ASSERT_TRUE(str_const.size() == sizeof(charArray) - 1);
  ASSERT_TRUE(str_const.is_stable());
  ASSERT_TRUE(str.c_str() != charArray);
  ASSERT_TRUE(str.is_stable());
  cm::String substr = str.substr(1);
  cm::String const& substr_const = substr;
  ASSERT_TRUE(substr_const.data() != &charArray[1]);
  ASSERT_TRUE(substr_const.size() == 2);
  ASSERT_TRUE(!substr_const.is_stable());
  ASSERT_TRUE(substr.c_str() != &charArray[1]);
  ASSERT_TRUE(!substr.is_stable());
  return true;
}